

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,long *xn,xpath_allocator *alloc,byte once)

{
  xml_node_struct **ppxVar1;
  bool bVar2;
  xml_node_struct *in_RAX;
  xml_node xVar3;
  xml_node_struct *n;
  xml_node_struct *pxVar4;
  xml_node local_38;
  
  if (xn[1] == 0) {
    local_38._root = (xml_node_struct *)*xn;
  }
  else {
    local_38._root = in_RAX;
    xml_node::xml_node(&local_38);
  }
  if (local_38._root == (xml_node_struct *)0x0) {
    if ((xn[1] != 0) && (*xn != 0)) {
      if (xn[1] == 0) {
        if (*xn == 0) {
          xml_node::xml_node(&local_38);
          xVar3._root = local_38._root;
        }
        else {
          xml_node::xml_node(&local_38,*(xml_node_struct **)(*xn + 0x18));
          xVar3._root = local_38._root;
        }
      }
      else {
        xVar3._root = (xml_node_struct *)*xn;
      }
      while (xVar3._root != (xml_node_struct *)0x0) {
        pxVar4 = (xVar3._root)->first_child;
        if (pxVar4 == (xml_node_struct *)0x0) {
          while (pxVar4 = (xVar3._root)->next_sibling, pxVar4 == (xml_node_struct *)0x0) {
            xVar3._root = (xVar3._root)->parent;
            if (xVar3._root == (xml_node_struct *)0x0) {
              return;
            }
          }
        }
        bVar2 = step_push(this,ns,pxVar4,alloc);
        xVar3._root = pxVar4;
        if ((bVar2 & once) == 1) {
          return;
        }
      }
    }
  }
  else {
    if (xn[1] == 0) {
      xVar3._root = (xml_node_struct *)*xn;
      local_38._root = xVar3._root;
    }
    else {
      xml_node::xml_node(&local_38);
      xVar3._root = local_38._root;
    }
    do {
      pxVar4 = (xVar3._root)->next_sibling;
      if (pxVar4 != (xml_node_struct *)0x0) {
        bVar2 = step_push(this,ns,pxVar4,alloc);
        do {
          if ((bVar2 & once) != 0) {
            return;
          }
          n = pxVar4->first_child;
          if (n == (xml_node_struct *)0x0) {
            while (n = pxVar4->next_sibling, n == (xml_node_struct *)0x0) {
              pxVar4 = pxVar4->parent;
              if (pxVar4 == (xml_node_struct *)0x0) {
                return;
              }
            }
          }
          bVar2 = step_push(this,ns,n,alloc);
          pxVar4 = n;
        } while( true );
      }
      ppxVar1 = &(xVar3._root)->parent;
      xVar3._root = *ppxVar1;
    } while (*ppxVar1 != (xml_node_struct *)0x0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}